

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

Tour * tour_copy(Tour *__return_storage_ptr__,Tour *other)

{
  int32_t *piVar1;
  int iVar2;
  
  __return_storage_ptr__->num_customers = 0;
  __return_storage_ptr__->num_comps = 0;
  __return_storage_ptr__->succ = (int32_t *)0x0;
  __return_storage_ptr__->comp = (int32_t *)0x0;
  iVar2 = other->num_customers;
  __return_storage_ptr__->num_customers = iVar2;
  __return_storage_ptr__->num_comps = other->num_comps;
  iVar2 = iVar2 + 1;
  piVar1 = veci32_copy(other->succ,iVar2);
  __return_storage_ptr__->succ = piVar1;
  piVar1 = veci32_copy(other->comp,iVar2);
  __return_storage_ptr__->comp = piVar1;
  return __return_storage_ptr__;
}

Assistant:

Tour tour_copy(Tour const *other) {
    Tour result = {0};
    result.num_customers = other->num_customers;

    result.num_comps = other->num_comps;
    result.succ = veci32_copy(other->succ, result.num_customers + 1);
    result.comp = veci32_copy(other->comp, result.num_customers + 1);
    return result;
}